

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O3

void ScaleAddRow_16_C(uint16_t *src_ptr,uint32_t *dst_ptr,int src_width)

{
  int iVar1;
  
  if (1 < src_width) {
    iVar1 = 0;
    do {
      *(ulong *)dst_ptr =
           CONCAT44((int)((ulong)*(undefined8 *)dst_ptr >> 0x20) + (*(uint *)src_ptr >> 0x10),
                    (int)*(undefined8 *)dst_ptr + (*(uint *)src_ptr & 0xffff));
      src_ptr = (uint16_t *)((long)src_ptr + 4);
      dst_ptr = dst_ptr + 2;
      iVar1 = iVar1 + 2;
    } while (iVar1 < src_width + -1);
  }
  if ((src_width & 1U) != 0) {
    *dst_ptr = *dst_ptr + (uint)(ushort)*(uint *)src_ptr;
  }
  return;
}

Assistant:

void ScaleAddRow_16_C(const uint16_t* src_ptr,
                      uint32_t* dst_ptr,
                      int src_width) {
  int x;
  assert(src_width > 0);
  for (x = 0; x < src_width - 1; x += 2) {
    dst_ptr[0] += src_ptr[0];
    dst_ptr[1] += src_ptr[1];
    src_ptr += 2;
    dst_ptr += 2;
  }
  if (src_width & 1) {
    dst_ptr[0] += src_ptr[0];
  }
}